

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_helpers.c
# Opt level: O3

void kvtree_free(void *p)

{
  if (p != (void *)0x0) {
    if (*p != (void *)0x0) {
      free(*p);
    }
    *(undefined8 *)p = 0;
  }
  return;
}

Assistant:

void kvtree_free(void* p)
{
  /* verify that we got a valid pointer to a pointer */
  if (p != NULL) {
    /* free memory if there is any */
    void* ptr = *(void**)p;
    if (ptr != NULL) {
       free(ptr);
    }

    /* set caller's pointer to NULL */
    *(void**)p = NULL;
  }
}